

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall cmCTestCoverageHandler::LoadLabels(cmCTestCoverageHandler *this,char *dir)

{
  vector<int,_std::allocator<int>_> *this_00;
  cmCTest *this_01;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  set<int,std::less<int>,std::allocator<int>> *this_02;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  LabelSet *labelSet;
  _Base_ptr local_4c8;
  undefined1 local_4c0;
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  int local_4a4;
  undefined1 local_4a0 [4];
  int id;
  string label;
  vector<int,_std::allocator<int>_> targetLabels;
  string line;
  string source;
  string local_420 [7];
  bool inTarget;
  undefined1 local_400 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_280 [8];
  ifstream fin;
  undefined1 local_78 [8];
  string fname;
  allocator<char> local_41;
  key_type local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *local_20;
  LabelSet *dirLabels;
  char *dir_local;
  cmCTestCoverageHandler *this_local;
  
  dirLabels = (LabelSet *)dir;
  dir_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,dir,&local_41);
  psVar4 = &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
            ::operator[](&this->TargetDirs,&local_40)->
            super_set<int,_std::less<int>,_std::allocator<int>_>;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = psVar4;
  cmStrCat<char_const*&,char_const(&)[12]>
            ((string *)local_78,(char **)&dirLabels,(char (*) [12])0x11081b4);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_280,pcVar5,_S_in);
  bVar2 = std::ios::operator!((ios *)(local_280 + (long)*(_func_int **)((long)local_280 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
    poVar6 = std::operator<<((ostream *)local_400," loading labels from [");
    poVar6 = std::operator<<(poVar6,(string *)local_78);
    std::operator<<(poVar6,"]\n");
    this_01 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_01,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x87b,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_420);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
    bVar1 = true;
    std::__cxx11::string::string((string *)(line.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8));
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_280,
                              (string *)
                              &targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(bool *)0x0,
                              0xffffffffffffffff), bVar3) {
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         (pcVar5 = (char *)std::__cxx11::string::operator[]
                                     ((ulong)&targetLabels.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_end_of_storage),
         *pcVar5 != '#')) {
        pcVar5 = (char *)std::__cxx11::string::operator[]
                                   ((ulong)&targetLabels.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage);
        if (*pcVar5 == ' ') {
          std::__cxx11::string::substr
                    ((ulong)local_4a0,
                     (ulong)&targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
          local_4a4 = GetLabelId(this,(string *)local_4a0);
          pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(local_20,&local_4a4);
          local_4b8 = (_Base_ptr)pVar8.first._M_node;
          local_4b0 = pVar8.second;
          if (bVar1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8),&local_4a4);
          }
          else {
            psVar4 = &std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                      ::operator[](&this->SourceLabels,(key_type *)((long)&line.field_2 + 8))->
                      super_set<int,_std::less<int>,_std::allocator<int>_>;
            pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(psVar4,&local_4a4);
            local_4c8 = (_Base_ptr)pVar8.first._M_node;
            local_4c0 = pVar8.second;
          }
          std::__cxx11::string::~string((string *)local_4a0);
        }
        else {
          bVar1 = false;
          cmCTest::GetShortPathToFile
                    ((string *)&labelSet,(this->super_cmCTestGenericHandler).CTest,
                     (string *)
                     &targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=
                    ((string *)(line.field_2._M_local_buf + 8),(string *)&labelSet);
          std::__cxx11::string::~string((string *)&labelSet);
          this_02 = (set<int,std::less<int>,std::allocator<int>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
                    ::operator[](&this->SourceLabels,(key_type *)(line.field_2._M_local_buf + 8));
          this_00 = (vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8);
          __first = std::vector<int,_std::allocator<int>_>::begin(this_00);
          __last = std::vector<int,_std::allocator<int>_>::end(this_00);
          std::set<int,std::less<int>,std::allocator<int>>::
          insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (this_02,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             __first._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     __last._M_current);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)((long)&label.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &targetLabels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  }
  std::ifstream::~ifstream(local_280);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void cmCTestCoverageHandler::LoadLabels(const char* dir)
{
  LabelSet& dirLabels = this->TargetDirs[dir];
  std::string fname = cmStrCat(dir, "/Labels.txt");
  cmsys::ifstream fin(fname.c_str());
  if (!fin) {
    return;
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " loading labels from [" << fname << "]\n", this->Quiet);
  bool inTarget = true;
  std::string source;
  std::string line;
  std::vector<int> targetLabels;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty() || line[0] == '#') {
      // Ignore blank and comment lines.
      continue;
    }
    if (line[0] == ' ') {
      // Label lines appear indented by one space.
      std::string label = line.substr(1);
      int id = this->GetLabelId(label);
      dirLabels.insert(id);
      if (inTarget) {
        targetLabels.push_back(id);
      } else {
        this->SourceLabels[source].insert(id);
      }
    } else {
      // Non-indented lines specify a source file name.  The first one
      // is the end of the target-wide labels.
      inTarget = false;

      source = this->CTest->GetShortPathToFile(line);

      // Label the source with the target labels.
      LabelSet& labelSet = this->SourceLabels[source];
      labelSet.insert(targetLabels.begin(), targetLabels.end());
    }
  }
}